

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O2

void __thiscall
five_point_solver::five_point_solver
          (five_point_solver *this,field3d<celle> *ce0,field3d<cellb> *cb0,field3d<cellj> *cj0,
          double dt,double dx,double dy,double dz)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined8 uStack_20;
  undefined8 uStack_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar14._8_56_ = in_register_00001288;
  auVar14._0_8_ = dy;
  auVar12._8_56_ = in_register_00001248;
  auVar12._0_8_ = dx;
  auVar15._8_8_ = dt;
  auVar15._0_8_ = dt;
  (this->super_maxwell_solver).ce = ce0;
  (this->super_maxwell_solver).cb = cb0;
  (this->super_maxwell_solver).cj = cj0;
  (this->super_maxwell_solver).dx = dx;
  (this->super_maxwell_solver).dy = dy;
  auVar3 = vunpcklpd_avx(auVar12._0_16_,auVar14._0_16_);
  auVar4._0_8_ = dt / dz;
  (this->super_maxwell_solver).dz = dz;
  auVar3 = vdivpd_avx(auVar15,auVar3);
  (this->super_maxwell_solver).dtdx = (double)auVar3._0_8_;
  (this->super_maxwell_solver).dtdy = (double)auVar3._8_8_;
  (this->super_maxwell_solver).dtdz = auVar4._0_8_;
  auVar5 = vminsd_avx(auVar3,ZEXT816(0x3ff0000000000000));
  (this->super_maxwell_solver)._vptr_maxwell_solver = (_func_int **)&PTR_advance_b_00136be0;
  auVar6._0_8_ = sin(auVar5._0_8_ * 1.5707963267948966);
  auVar6._8_56_ = extraout_var;
  uStack_20 = in_register_00001248._0_8_;
  auVar9._0_8_ = dx / dt;
  auVar9._8_8_ = uStack_20;
  auVar5 = vfnmadd213sd_fma(auVar9,auVar6._0_16_,ZEXT816(0x3ff0000000000000));
  this->ax = auVar5._0_8_ * 0.25;
  auVar3 = vpermilpd_avx(auVar3,1);
  auVar3 = vminsd_avx(auVar3,ZEXT816(0x3ff0000000000000));
  auVar7._0_8_ = sin(auVar3._0_8_ * 1.5707963267948966);
  auVar7._8_56_ = extraout_var_00;
  uStack_10 = in_register_00001288._0_8_;
  auVar10._0_8_ = dy / dt;
  auVar10._8_8_ = uStack_10;
  auVar3 = vfnmadd213sd_fma(auVar10,auVar7._0_16_,ZEXT816(0x3ff0000000000000));
  this->ay = auVar3._0_8_ * 0.25;
  auVar4._8_8_ = 0;
  auVar3 = vminsd_avx(auVar4,ZEXT816(0x3ff0000000000000));
  auVar8._0_8_ = sin(auVar3._0_8_ * 1.5707963267948966);
  auVar8._8_56_ = extraout_var_01;
  auVar13._8_8_ = 0xc000000000000000;
  auVar13._0_8_ = 0xc000000000000000;
  auVar11._0_8_ = dz / dt;
  auVar11._8_8_ = 0;
  auVar3 = vfnmadd213sd_fma(auVar11,auVar8._0_16_,ZEXT816(0x3ff0000000000000));
  dVar1 = auVar3._0_8_ * 0.25;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar5 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar5,ZEXT816(0xc000000000000000));
  this->az = dVar1;
  auVar3._0_8_ = this->ax;
  auVar3._8_8_ = this->ay;
  auVar2._8_8_ = 0x3ff0000000000000;
  auVar2._0_8_ = 0x3ff0000000000000;
  auVar3 = vfmadd213pd_avx512vl(auVar13,auVar3,auVar2);
  this->bx = (double)auVar3._0_8_;
  this->by = (double)auVar3._8_8_;
  this->bz = auVar5._0_8_;
  return;
}

Assistant:

five_point_solver::five_point_solver(field3d<celle> & ce0, field3d<cellb> & cb0, field3d<cellj> & cj0, double dt, double dx,
        double dy, double dz) :
        maxwell_solver(ce0, cb0, cj0, dt, dx, dy, dz),
        ax(0.25 * (1 - dx / dt * sin(0.5 * PI * std::min(1.0, dt / dx)))),
        ay(0.25 * (1 - dy / dt * sin(0.5 * PI * std::min(1.0, dt / dy)))),
        az(0.25 * (1 - dz / dt * sin(0.5 * PI * std::min(1.0, dt / dz)))) {
    bx = 1 - 2 * ax;
    by = 1 - 2 * ay;
    bz = 1 - 2 * az;
}